

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_checkbox_flags_text(nk_context *ctx,char *text,int len,uint *flags,uint value)

{
  int iVar1;
  uint local_38;
  uint local_34;
  int active;
  uint value_local;
  uint *flags_local;
  char *pcStack_20;
  int len_local;
  char *text_local;
  nk_context *ctx_local;
  
  local_34 = value;
  _active = flags;
  flags_local._4_4_ = len;
  pcStack_20 = text;
  text_local = (char *)ctx;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5234,
                  "int nk_checkbox_flags_text(struct nk_context *, const char *, int, unsigned int *, unsigned int)"
                 );
  }
  if (text != (char *)0x0) {
    if (flags != (uint *)0x0) {
      if (((ctx == (nk_context *)0x0) || (text == (char *)0x0)) || (flags == (uint *)0x0)) {
        ctx_local._4_4_ = 0;
      }
      else {
        local_38 = *flags & value & value;
        iVar1 = nk_checkbox_text(ctx,text,len,(int *)&local_38);
        if (iVar1 == 0) {
          ctx_local._4_4_ = 0;
        }
        else {
          if (local_38 == 0) {
            *_active = (local_34 ^ 0xffffffff) & *_active;
          }
          else {
            *_active = local_34 | *_active;
          }
          ctx_local._4_4_ = 1;
        }
      }
      return ctx_local._4_4_;
    }
    __assert_fail("flags",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5236,
                  "int nk_checkbox_flags_text(struct nk_context *, const char *, int, unsigned int *, unsigned int)"
                 );
  }
  __assert_fail("text",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x5235,
                "int nk_checkbox_flags_text(struct nk_context *, const char *, int, unsigned int *, unsigned int)"
               );
}

Assistant:

NK_API int
nk_checkbox_flags_text(struct nk_context *ctx, const char *text, int len,
    unsigned int *flags, unsigned int value)
{
    int active;
    NK_ASSERT(ctx);
    NK_ASSERT(text);
    NK_ASSERT(flags);
    if (!ctx || !text || !flags) return 0;

    active = (int)((*flags & value) & value);
    if (nk_checkbox_text(ctx, text, len, &active)) {
        if (active) *flags |= value;
        else *flags &= ~value;
        return 1;
    }
    return 0;
}